

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O3

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_> *pFVar4;
  FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_> *pFVar5;
  bool bVar6;
  double *pdVar7;
  uint uVar8;
  ulong uVar9;
  value_type vVar10;
  double dVar11;
  double dVar12;
  
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar5 = (fadexpr->fadexpr_).right_;
  uVar2 = (((pFVar4->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar4->fadexpr_).right_)->fadexpr_).expr_.dx_.num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (((pFVar5->fadexpr_).expr_.fadexpr_.left_)->dx_).num_elts;
  uVar8 = (((pFVar5->fadexpr_).expr_.fadexpr_.right_)->dx_).num_elts;
  if ((int)uVar8 < (int)uVar2) {
    uVar8 = uVar2;
  }
  if ((int)uVar8 < (int)uVar3) {
    uVar8 = uVar3;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar8 == uVar2) {
    if (uVar8 == 0) goto LAB_013fce3e;
    pdVar7 = (this->dx_).ptr_to_data;
  }
  else {
    if (uVar8 == 0) {
      if (uVar2 != 0) {
        pdVar7 = (this->dx_).ptr_to_data;
        if (pdVar7 != (double *)0x0) {
          operator_delete__(pdVar7);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      goto LAB_013fce3e;
    }
    if (uVar2 != 0) {
      pdVar7 = (this->dx_).ptr_to_data;
      if (pdVar7 != (double *)0x0) {
        operator_delete__(pdVar7);
      }
      (this->dx_).ptr_to_data = (double *)0x0;
    }
    (this->dx_).num_elts = uVar8;
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar8) {
      uVar9 = (ulong)uVar8 << 3;
    }
    pdVar7 = (double *)operator_new__(uVar9);
    (this->dx_).ptr_to_data = pdVar7;
  }
  bVar6 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
          ::hasFastAccess(&fadexpr->fadexpr_);
  if (bVar6) {
    if (0 < (int)uVar8) {
      uVar9 = 0;
      do {
        vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
                 ::fastAccessDx(&fadexpr->fadexpr_,(int)uVar9);
        pdVar7[uVar9] = vVar10;
        uVar9 = uVar9 + 1;
      } while (uVar8 != uVar9);
    }
  }
  else if (0 < (int)uVar8) {
    uVar9 = 0;
    do {
      vVar10 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadFuncExp<Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>_>
               ::dx(&fadexpr->fadexpr_,(int)uVar9);
      pdVar7[uVar9] = vVar10;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
LAB_013fce3e:
  pFVar4 = (fadexpr->fadexpr_).left_;
  dVar1 = ((pFVar4->fadexpr_).left_)->val_;
  dVar11 = exp((((pFVar4->fadexpr_).right_)->fadexpr_).expr_.val_);
  pFVar5 = (fadexpr->fadexpr_).right_;
  dVar12 = sin(((pFVar5->fadexpr_).expr_.fadexpr_.left_)->val_ *
               ((pFVar5->fadexpr_).expr_.fadexpr_.right_)->val_);
  this->val_ = dVar12 * dVar11 * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}